

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer first;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  _Head_base<0UL,__IO_FILE_*,_false> __stream;
  size_t sVar4;
  int *piVar5;
  char *pcVar6;
  int iVar7;
  unique_ptr<_IO_FILE,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_tools_import_import_cpp:62:28)>
  infile;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  string local_238 [32];
  string local_218 [32];
  parser<pstore::exchange::import_ns::callbacks> parser;
  database db;
  
  std::__cxx11::string::string((string *)&db,"pstore import utility\n",(allocator *)&parser);
  pstore::command_line::parse_command_line_options(argc,argv,(string *)&db);
  std::__cxx11::string::~string((string *)&db);
  bVar1 = pstore::file::exists((string *)((anonymous_namespace)::db_path_abi_cxx11_ + 0x88));
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "error: the import database must not be an existing file.");
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar7 = 1;
  }
  else {
    iVar7 = 1;
    pstore::database::database
              (&db,(string *)((anonymous_namespace)::db_path_abi_cxx11_ + 0x88),writable,true);
    bVar1 = anon_unknown.dwarf_966a::is_file_input();
    __stream._M_head_impl = (_IO_FILE *)_stdin;
    if (bVar1) {
      __stream._M_head_impl =
           (_IO_FILE *)fopen((char *)(anonymous_namespace)::json_source_abi_cxx11_._136_8_,"r");
    }
    infile._M_t.
    super___uniq_ptr_impl<_IO_FILE,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_tools_import_import_cpp:62:28)>
    ._M_t.
    super__Tuple_impl<0UL,__IO_FILE_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_tools_import_import_cpp:62:28)>
    .super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl =
         (__uniq_ptr_data<_IO_FILE,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_tools_import_import_cpp:62:28),_true,_false>
          )(__uniq_ptr_data<_IO_FILE,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_tools_import_import_cpp:62:28),_true,_false>
            )__stream._M_head_impl;
    if ((tuple<_IO_FILE_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_tools_import_import_cpp:62:28)>
         )__stream._M_head_impl == (_Head_base<0UL,__IO_FILE_*,_false>)0x0) {
      piVar5 = __errno_location();
      iVar7 = *piVar5;
      poVar3 = std::operator<<((ostream *)&std::cerr,"error: could not open \"");
      (anonymous_namespace)::input_name_abi_cxx11_();
      poVar3 = std::operator<<(poVar3,(string *)&parser);
      poVar3 = std::operator<<(poVar3,"\": ");
      pcVar6 = strerror(iVar7);
      poVar3 = std::operator<<(poVar3,pcVar6);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&parser);
      iVar7 = 1;
    }
    else {
      pstore::exchange::import_ns::create_parser(&parser,&db);
      buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&buffer,0xffff);
      do {
        first = buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
        sVar4 = fread(buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,1,
                      (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_start,(FILE *)__stream._M_head_impl)
        ;
        if ((sVar4 < (ulong)((long)buffer.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)buffer.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start)) &&
           (iVar2 = ferror((FILE *)__stream._M_head_impl), iVar2 != 0)) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"error: there was an error reading input");
          std::endl<char,std::char_traits<char>>(poVar3);
          goto LAB_0010f01a;
        }
        pstore::json::parser<pstore::exchange::import_ns::callbacks>::input<char*>
                  (&parser,(char *)first,(char *)(first + sVar4));
        if (parser.error_._M_value != 0) {
          (anonymous_namespace)::input_name_abi_cxx11_();
          poVar3 = std::operator<<((ostream *)&std::cerr,local_218);
          poVar3 = std::operator<<(poVar3,":");
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          poVar3 = std::operator<<(poVar3,":");
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          poVar3 = std::operator<<(poVar3,": error: ");
          (**(code **)(*(long *)parser.error_._M_cat + 0x20))
                    (local_238,parser.error_._M_cat,parser.error_._M_value);
          poVar3 = std::operator<<(poVar3,local_238);
          std::endl<char,std::char_traits<char>>(poVar3);
          std::__cxx11::string::~string(local_238);
          std::__cxx11::string::~string(local_218);
          goto LAB_0010f01a;
        }
        iVar2 = feof((FILE *)__stream._M_head_impl);
      } while (iVar2 == 0);
      iVar7 = 0;
      pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(&parser);
LAB_0010f01a:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser(&parser);
    }
    std::
    unique_ptr<_IO_FILE,_const_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/import/import.cpp:62:28)>
    ::~unique_ptr(&infile);
    pstore::database::~database(&db);
  }
  return iVar7;
}

Assistant:

int main (int argc, char * argv[]) {
#endif
    int exit_code = EXIT_SUCCESS;
    PSTORE_TRY {
        parse_command_line_options (argc, argv, "pstore import utility\n");

        if (pstore::file::exists (db_path.get ())) {
            error_stream << PSTORE_NATIVE_TEXT (
                                "error: the import database must not be an existing file.")
                         << std::endl;
            return EXIT_FAILURE;
        }

        pstore::database db{db_path.get (), pstore::database::access_mode::writable};

        auto const close = [] (FILE * const file) {
            if (file != stdin) {
                std::fclose (file);
            }
        };
        std::unique_ptr<FILE, decltype (close)> infile{open_input (), close};
        if (infile.get () == nullptr) {
            auto const err = errno;
            error_stream << PSTORE_NATIVE_TEXT (R"(error: could not open ")")
                         << pstore::utf::to_native_string (input_name ()) << R"(": )"
                         << std::strerror (err) << std::endl;
            return EXIT_FAILURE;
        }

        auto parser = pstore::exchange::import_ns::create_parser (db);

        std::vector<std::uint8_t> buffer;
        buffer.resize (65535);

        for (;;) {
            auto * const ptr = reinterpret_cast<char *> (buffer.data ());
            std::size_t const nread =
                std::fread (ptr, sizeof (std::uint8_t), buffer.size (), infile.get ());
            if (nread < buffer.size ()) {
                if (std::ferror (infile.get ())) {
                    error_stream << PSTORE_NATIVE_TEXT ("error: there was an error reading input")
                                 << std::endl;
                    exit_code = EXIT_FAILURE;
                    break;
                }
            }

            parser.input (ptr, ptr + nread);
            if (parser.has_error ()) {
                auto const coord = parser.coordinate ();
                error_stream << pstore::utf::to_native_string (input_name ())
                             << PSTORE_NATIVE_TEXT (":") << coord.row << PSTORE_NATIVE_TEXT (":")
                             << coord.column << PSTORE_NATIVE_TEXT (": error: ")
                             << pstore::utf::to_native_string (parser.last_error ().message ())
                             << std::endl;
                exit_code = EXIT_FAILURE;
                break;
            }

            // Stop if we've reached the end of the file.
            if (std::feof (infile.get ())) {
                parser.eof ();
                break;
            }
        }
    }